

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distance.c
# Opt level: O2

int main(int argc,char **argv)

{
  float fVar1;
  bool bVar2;
  longlong lVar3;
  int iVar4;
  FILE *__stream;
  void *pvVar5;
  char *pcVar6;
  longlong lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  char cVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  float fVar15;
  longlong size;
  void *pvStack_34180;
  ulong uStack_34178;
  char *pcStack_34170;
  long lStack_34168;
  longlong words;
  float afStack_34158 [38];
  undefined8 auStack_340c0 [41];
  longlong bi [100];
  char acStack_33c58 [2000];
  float afStack_33488 [2000];
  char acStack_31548 [2000];
  char acStack_30d78 [200008];
  
  if (argc < 2) {
    puts("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT");
LAB_0010121e:
    iVar4 = 0;
  }
  else {
    strcpy(acStack_31548,argv[1]);
    __stream = fopen(acStack_31548,"rb");
    if (__stream == (FILE *)0x0) {
      puts("Input file not found");
    }
    else {
      __isoc99_fscanf(__stream,"%lld",&words);
      __isoc99_fscanf(__stream,"%lld",&size);
      lVar7 = words;
      pcStack_34170 = (char *)malloc(words * 0x32);
      for (lVar14 = 0; lVar3 = size, lVar14 != 0x28; lVar14 = lVar14 + 1) {
        pvVar5 = malloc(2000);
        auStack_340c0[lVar14 + 1] = pvVar5;
      }
      uVar13 = size * lVar7;
      pvStack_34180 = malloc(uVar13 * 4);
      if (pvStack_34180 != (void *)0x0) {
        lVar12 = 0;
        lVar14 = 0;
        while (pcVar6 = pcStack_34170, lVar14 < lVar7) {
          uVar13 = 0;
          lStack_34168 = lVar14;
          while( true ) {
            iVar4 = fgetc(__stream);
            cVar11 = (char)iVar4;
            pcVar6[uVar13 + lVar14 * 0x32] = cVar11;
            iVar4 = feof(__stream);
            if ((cVar11 == ' ') || (iVar4 != 0)) break;
            uVar13 = uVar13 + (cVar11 != '\n' && uVar13 < 0x32);
          }
          pcVar6[uVar13 + lVar14 * 0x32] = '\0';
          pvVar5 = pvStack_34180;
          for (lVar14 = 0; lVar14 < size; lVar14 = lVar14 + 1) {
            fread((void *)(size * lVar12 + (long)pvVar5),4,1,__stream);
            pvVar5 = (void *)((long)pvVar5 + 4);
          }
          lVar14 = 0;
          if (0 < size) {
            lVar14 = size;
          }
          fVar15 = 0.0;
          for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
            fVar1 = *(float *)((long)pvStack_34180 + lVar8 * 4 + size * lVar12);
            fVar15 = fVar15 + fVar1 * fVar1;
          }
          if (fVar15 < 0.0) {
            fVar15 = sqrtf(fVar15);
          }
          else {
            fVar15 = SQRT(fVar15);
          }
          lVar14 = 0;
          if (0 < size) {
            lVar14 = size;
          }
          for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
            *(float *)((long)pvStack_34180 + lVar8 * 4 + size * lVar12) =
                 *(float *)((long)pvStack_34180 + lVar8 * 4 + size * lVar12) / fVar15;
          }
          lVar12 = lVar12 + 4;
          lVar7 = words;
          lVar14 = lStack_34168 + 1;
        }
        fclose(__stream);
LAB_00101408:
        lVar14 = 0;
LAB_0010140a:
        for (; lVar14 != 0x28; lVar14 = lVar14 + 1) {
          afStack_34158[lVar14] = 0.0;
        }
        for (lVar14 = 0; lVar14 != 0x28; lVar14 = lVar14 + 1) {
          *(undefined1 *)auStack_340c0[lVar14 + 1] = 0;
        }
        printf("Enter word or sentence (EXIT to break): ");
        uVar13 = 0;
        do {
          uVar9 = uVar13;
          iVar4 = fgetc(_stdin);
          acStack_33c58[uVar9] = (char)iVar4;
          if ((char)iVar4 == '\n') break;
          uVar13 = uVar9 + 1;
        } while (uVar9 < 1999);
        acStack_33c58[uVar9] = '\0';
        iVar4 = bcmp(acStack_33c58,"EXIT",5);
        if (iVar4 != 0) {
          pcVar6 = acStack_30d78 + 1;
          lVar14 = 0;
          uStack_34178 = 0;
          do {
            lVar12 = 0;
            do {
              pcVar6[lVar12 + -1] = acStack_33c58[lVar12 + lVar14];
              pcVar6[lVar12] = '\0';
              lVar8 = lVar12 + lVar14;
              lVar12 = lVar12 + 1;
              if (acStack_33c58[lVar8 + 1] == '\0') {
                uVar13 = 0;
                goto LAB_001014df;
              }
            } while (acStack_33c58[lVar8 + 1] != ' ');
            uStack_34178 = uStack_34178 + 1;
            pcVar6 = pcVar6 + 2000;
            lVar14 = lVar14 + lVar12 + 1;
          } while( true );
        }
        goto LAB_0010121e;
      }
      printf("Cannot allocate memory: %lld MB    %lld  %lld\n",uVar13 >> 0x12 & 0xfffffffffff,lVar7,
             lVar3);
    }
    iVar4 = -1;
  }
  return iVar4;
LAB_001014df:
  lVar7 = words;
  pvVar5 = pvStack_34180;
  if (uVar13 <= uStack_34178) {
    lVar14 = 0;
    if (0 < words) {
      lVar14 = words;
    }
    lVar8 = 0;
    pcVar6 = pcStack_34170;
    while ((lVar12 = lVar14, lVar14 != lVar8 &&
           (iVar4 = strcmp(pcVar6,acStack_30d78 + uVar13 * 2000), lVar12 = lVar8, iVar4 != 0))) {
      lVar8 = lVar8 + 1;
      pcVar6 = pcVar6 + 0x32;
    }
    lVar14 = lVar12;
    if (lVar12 == lVar7) {
      lVar14 = -1;
    }
    bi[uVar13] = lVar14;
    printf("\nWord: %s  Position in vocabulary: %lld\n",acStack_30d78 + uVar13 * 2000);
    uVar13 = uVar13 + 1;
    if (lVar12 == lVar7) goto code_r0x0010156f;
    goto LAB_001014df;
  }
  lVar14 = 0;
  if (lVar12 == -1) goto LAB_0010140a;
  puts(
      "\n                                              Word       Cosine distance\n------------------------------------------------------------------------"
      );
  lVar14 = 0;
  if (0 < size) {
    lVar14 = size;
  }
  for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
    afStack_33488[lVar12] = 0.0;
  }
  for (uVar13 = 0; uVar13 <= uStack_34178; uVar13 = uVar13 + 1) {
    lVar12 = bi[uVar13];
    if (lVar12 != -1) {
      for (lVar8 = 0; lVar14 != lVar8; lVar8 = lVar8 + 1) {
        afStack_33488[lVar8] =
             *(float *)((long)pvVar5 + lVar8 * 4 + lVar12 * size * 4) + afStack_33488[lVar8];
      }
    }
  }
  fVar15 = 0.0;
  for (lVar12 = 0; lVar14 != lVar12; lVar12 = lVar12 + 1) {
    fVar15 = fVar15 + afStack_33488[lVar12] * afStack_33488[lVar12];
  }
  if (fVar15 < 0.0) {
    fVar15 = sqrtf(fVar15);
  }
  else {
    fVar15 = SQRT(fVar15);
  }
  lVar7 = size;
  if (size < 1) {
    lVar7 = 0;
  }
  for (lVar14 = 0; lVar7 != lVar14; lVar14 = lVar14 + 1) {
    afStack_33488[lVar14] = afStack_33488[lVar14] / fVar15;
  }
  for (lVar14 = 0; lVar14 != 0x28; lVar14 = lVar14 + 1) {
    afStack_34158[lVar14] = -1.0;
  }
  for (lVar14 = 0; lVar14 != 0x28; lVar14 = lVar14 + 1) {
    *(undefined1 *)auStack_340c0[lVar14 + 1] = 0;
  }
  lVar14 = 0;
  uVar13 = uStack_34178;
  for (lVar12 = 0; lVar12 < words; lVar12 = lVar12 + 1) {
    bVar2 = false;
    for (uVar9 = 0; uVar9 <= uVar13; uVar9 = uVar9 + 1) {
      if (bi[uVar9] == lVar12) {
        bVar2 = true;
      }
    }
    if (!bVar2) {
      lVar8 = 0;
      if (0 < size) {
        lVar8 = size;
      }
      fVar15 = 0.0;
      for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 1) {
        fVar15 = fVar15 + afStack_33488[lVar10] *
                          *(float *)((long)pvVar5 + lVar10 * 4 + size * lVar14);
      }
      uVar9 = 0;
LAB_00101724:
      if (uVar9 != 0x28) {
        if (fVar15 < afStack_34158[uVar9] || fVar15 == afStack_34158[uVar9]) goto code_r0x00101732;
        lStack_34168 = CONCAT44(lStack_34168._4_4_,fVar15);
        for (uVar13 = 0x27; uVar9 < uVar13; uVar13 = uVar13 - 1) {
          afStack_34158[uVar13] = afStack_34158[uVar13 - 1];
          strcpy((char *)auStack_340c0[uVar13 + 1],(char *)auStack_340c0[uVar13]);
          fVar15 = (float)lStack_34168;
        }
        afStack_34158[uVar9] = fVar15;
        strcpy((char *)auStack_340c0[uVar9 + 1],pcStack_34170 + lVar12 * 0x32);
        uVar13 = uStack_34178;
      }
    }
    lVar14 = lVar14 + 4;
  }
  for (lVar14 = 0; lVar14 != 0x28; lVar14 = lVar14 + 1) {
    printf("%50s\t\t%f\n",(double)afStack_34158[lVar14],auStack_340c0[lVar14 + 1]);
  }
  goto LAB_00101408;
code_r0x0010156f:
  puts("Out of dictionary word!");
  lVar14 = 0;
  goto LAB_0010140a;
code_r0x00101732:
  uVar9 = uVar9 + 1;
  goto LAB_00101724;
}

Assistant:

int main(int argc, char **argv) {
  FILE *f;
  char st1[max_size];
  char *bestw[N];
  char file_name[max_size], st[100][max_size];
  float dist, len, bestd[N], vec[max_size];
  long long words, size, a, b, c, d, cn, bi[100];
  // char ch;
  float *M;
  char *vocab;
  if (argc < 2) {
    printf("Usage: ./distance <FILE>\nwhere FILE contains word projections in the BINARY FORMAT\n");
    return 0;
  }
  strcpy(file_name, argv[1]);
  f = fopen(file_name, "rb");
  if (f == NULL) {
    printf("Input file not found\n");
    return -1;
  }
  fscanf(f, "%lld", &words);
  fscanf(f, "%lld", &size);
  vocab = (char *)malloc((long long)words * max_w * sizeof(char));
  for (a = 0; a < N; a++) bestw[a] = (char *)malloc(max_size * sizeof(char));
  M = (float *)malloc((long long)words * (long long)size * sizeof(float));
  if (M == NULL) {
    printf("Cannot allocate memory: %lld MB    %lld  %lld\n", (long long)words * size * sizeof(float) / 1048576, words, size);
    return -1;
  }
  for (b = 0; b < words; b++) {
    a = 0;
    while (1) {
      vocab[b * max_w + a] = fgetc(f);
      if (feof(f) || (vocab[b * max_w + a] == ' ')) break;
      if ((a < max_w) && (vocab[b * max_w + a] != '\n')) a++;
    }
    vocab[b * max_w + a] = 0;
    for (a = 0; a < size; a++) fread(&M[a + b * size], sizeof(float), 1, f);
    len = 0;
    for (a = 0; a < size; a++) len += M[a + b * size] * M[a + b * size];
    len = sqrt(len);
    for (a = 0; a < size; a++) M[a + b * size] /= len;
  }
  fclose(f);
  while (1) {
    for (a = 0; a < N; a++) bestd[a] = 0;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    printf("Enter word or sentence (EXIT to break): ");
    a = 0;
    while (1) {
      st1[a] = fgetc(stdin);
      if ((st1[a] == '\n') || (a >= max_size - 1)) {
        st1[a] = 0;
        break;
      }
      a++;
    }
    if (!strcmp(st1, "EXIT")) break;
    cn = 0;
    b = 0;
    c = 0;
    while (1) {
      st[cn][b] = st1[c];
      b++;
      c++;
      st[cn][b] = 0;
      if (st1[c] == 0) break;
      if (st1[c] == ' ') {
        cn++;
        b = 0;
        c++;
      }
    }
    cn++;
    for (a = 0; a < cn; a++) {
      for (b = 0; b < words; b++) if (!strcmp(&vocab[b * max_w], st[a])) break;
      if (b == words) b = -1;
      bi[a] = b;
      printf("\nWord: %s  Position in vocabulary: %lld\n", st[a], bi[a]);
      if (b == -1) {
        printf("Out of dictionary word!\n");
        break;
      }
    }
    if (b == -1) continue;
    printf("\n                                              Word       Cosine distance\n------------------------------------------------------------------------\n");
    for (a = 0; a < size; a++) vec[a] = 0;
    for (b = 0; b < cn; b++) {
      if (bi[b] == -1) continue;
      for (a = 0; a < size; a++) vec[a] += M[a + bi[b] * size];
    }
    len = 0;
    for (a = 0; a < size; a++) len += vec[a] * vec[a];
    len = sqrt(len);
    for (a = 0; a < size; a++) vec[a] /= len;
    for (a = 0; a < N; a++) bestd[a] = -1;
    for (a = 0; a < N; a++) bestw[a][0] = 0;
    for (c = 0; c < words; c++) {
      a = 0;
      for (b = 0; b < cn; b++) if (bi[b] == c) a = 1;
      if (a == 1) continue;
      dist = 0;
      for (a = 0; a < size; a++) dist += vec[a] * M[a + c * size];
      for (a = 0; a < N; a++) {
        if (dist > bestd[a]) {
          for (d = N - 1; d > a; d--) {
            bestd[d] = bestd[d - 1];
            strcpy(bestw[d], bestw[d - 1]);
          }
          bestd[a] = dist;
          strcpy(bestw[a], &vocab[c * max_w]);
          break;
        }
      }
    }
    for (a = 0; a < N; a++) printf("%50s\t\t%f\n", bestw[a], bestd[a]);
  }
  return 0;
}